

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawLine
          (PixelGameEngine *this,int32_t x1,int32_t y1,int32_t x2,int32_t y2,Pixel p,
          uint32_t pattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  anon_class_8_1_54331e70 local_60;
  anon_class_8_1_54331e70 rol;
  int local_50;
  int i;
  int ye;
  int xe;
  int py;
  int px;
  int dy1;
  int dx1;
  int dy;
  int dx;
  int y;
  int x;
  int32_t y2_local;
  int32_t x2_local;
  int32_t y1_local;
  int32_t x1_local;
  PixelGameEngine *this_local;
  Pixel p_local;
  
  iVar2 = x2 - x1;
  iVar3 = y2 - y1;
  local_60.pattern = &pattern;
  y = y2;
  x = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = this;
  this_local._4_4_ = p.field_0;
  if (iVar2 == 0) {
    if (y2 < y1) {
      std::swap<int>(&y2_local,&y);
    }
    for (dy = y2_local; dy <= y; dy = dy + 1) {
      uVar4 = DrawLine::anon_class_8_1_54331e70::operator()(&local_60);
      if (uVar4 != 0) {
        (*this->_vptr_PixelGameEngine[5])
                  (this,(ulong)(uint)x2_local,(ulong)(uint)dy,(ulong)this_local._4_4_);
      }
    }
  }
  else if (iVar3 == 0) {
    if (x2 < x1) {
      std::swap<int>(&x2_local,&x);
    }
    for (dx = x2_local; dx <= x; dx = dx + 1) {
      uVar4 = DrawLine::anon_class_8_1_54331e70::operator()(&local_60);
      if (uVar4 != 0) {
        (*this->_vptr_PixelGameEngine[5])
                  (this,(ulong)(uint)dx,(ulong)(uint)y2_local,(ulong)this_local._4_4_);
      }
    }
  }
  else {
    iVar5 = iVar2;
    if (iVar2 < 1) {
      iVar5 = -iVar2;
    }
    iVar6 = iVar3;
    if (iVar3 < 1) {
      iVar6 = -iVar3;
    }
    xe = iVar6 * 2 - iVar5;
    ye = iVar5 * 2 - iVar6;
    dy = y2;
    dx = x2;
    if (iVar5 < iVar6) {
      local_50 = y1;
      if (-1 < iVar3) {
        local_50 = y2;
        dy = y1;
        dx = x1;
      }
      uVar4 = DrawLine::anon_class_8_1_54331e70::operator()(&local_60);
      if (uVar4 != 0) {
        (*this->_vptr_PixelGameEngine[5])
                  (this,(ulong)(uint)dx,(ulong)(uint)dy,(ulong)this_local._4_4_);
      }
      rol.pattern._4_4_ = 0;
      while (dy < local_50) {
        dy = dy + 1;
        iVar1 = iVar5;
        if (0 < ye) {
          if (((iVar2 < 0) && (iVar3 < 0)) || ((0 < iVar2 && (0 < iVar3)))) {
            dx = dx + 1;
          }
          else {
            dx = dx + -1;
          }
          iVar1 = iVar5 - iVar6;
        }
        ye = ye + iVar1 * 2;
        uVar4 = DrawLine::anon_class_8_1_54331e70::operator()(&local_60);
        if (uVar4 != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)dx,(ulong)(uint)dy,(ulong)this_local._4_4_);
        }
        rol.pattern._4_4_ = rol.pattern._4_4_ + 1;
      }
    }
    else {
      i = x1;
      if (-1 < iVar2) {
        i = x2;
        dy = y1;
        dx = x1;
      }
      uVar4 = DrawLine::anon_class_8_1_54331e70::operator()(&local_60);
      if (uVar4 != 0) {
        (*this->_vptr_PixelGameEngine[5])
                  (this,(ulong)(uint)dx,(ulong)(uint)dy,(ulong)this_local._4_4_);
      }
      rol.pattern._4_4_ = 0;
      while (dx < i) {
        dx = dx + 1;
        iVar1 = iVar6;
        if (-1 < xe) {
          if (((iVar2 < 0) && (iVar3 < 0)) || ((0 < iVar2 && (0 < iVar3)))) {
            dy = dy + 1;
          }
          else {
            dy = dy + -1;
          }
          iVar1 = iVar6 - iVar5;
        }
        xe = xe + iVar1 * 2;
        uVar4 = DrawLine::anon_class_8_1_54331e70::operator()(&local_60);
        if (uVar4 != 0) {
          (*this->_vptr_PixelGameEngine[5])
                    (this,(ulong)(uint)dx,(ulong)(uint)dy,(ulong)this_local._4_4_);
        }
        rol.pattern._4_4_ = rol.pattern._4_4_ + 1;
      }
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawLine(int32_t x1, int32_t y1, int32_t x2, int32_t y2, Pixel p, uint32_t pattern)
	{
		int x, y, dx, dy, dx1, dy1, px, py, xe, ye, i;
		dx = x2 - x1; dy = y2 - y1;

		auto rol = [&](void) { pattern = (pattern << 1) | (pattern >> 31); return pattern & 1; };

		// straight lines idea by gurkanctn
		if (dx == 0) // Line is vertical
		{
			if (y2 < y1) std::swap(y1, y2);
			for (y = y1; y <= y2; y++) if (rol()) Draw(x1, y, p);
			return;
		}

		if (dy == 0) // Line is horizontal
		{
			if (x2 < x1) std::swap(x1, x2);
			for (x = x1; x <= x2; x++) if (rol()) Draw(x, y1, p);
			return;
		}

		// Line is Funk-aye
		dx1 = abs(dx); dy1 = abs(dy);
		px = 2 * dy1 - dx1;	py = 2 * dx1 - dy1;
		if (dy1 <= dx1)
		{
			if (dx >= 0)
			{
				x = x1; y = y1; xe = x2;
			}
			else
			{
				x = x2; y = y2; xe = x1;
			}

			if (rol()) Draw(x, y, p);

			for (i = 0; x < xe; i++)
			{
				x = x + 1;
				if (px < 0)
					px = px + 2 * dy1;
				else
				{
					if ((dx < 0 && dy < 0) || (dx > 0 && dy > 0)) y = y + 1; else y = y - 1;
					px = px + 2 * (dy1 - dx1);
				}
				if (rol()) Draw(x, y, p);
			}
		}
		else
		{
			if (dy >= 0)
			{
				x = x1; y = y1; ye = y2;
			}
			else
			{
				x = x2; y = y2; ye = y1;
			}

			if (rol()) Draw(x, y, p);

			for (i = 0; y < ye; i++)
			{
				y = y + 1;
				if (py <= 0)
					py = py + 2 * dx1;
				else
				{
					if ((dx < 0 && dy < 0) || (dx > 0 && dy > 0)) x = x + 1; else x = x - 1;
					py = py + 2 * (dx1 - dy1);
				}
				if (rol()) Draw(x, y, p);
			}
		}
	}